

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rect-selection.cpp
# Opt level: O1

void __thiscall pal::RectHandle::setPosition(RectHandle *this,double p)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double _t1;
  double dVar4;
  double dVar5;
  
  _t1 = this->m_max_pos;
  if (p <= this->m_max_pos) {
    _t1 = p;
  }
  if (_t1 <= this->m_min_pos) {
    _t1 = this->m_min_pos;
  }
  dVar3 = position(this);
  dVar4 = _t1 - dVar3;
  uVar1 = -(ulong)(dVar4 < -dVar4);
  uVar2 = -(ulong)(_t1 < -_t1);
  dVar5 = (double)(~uVar2 & (ulong)_t1 | (ulong)-_t1 & uVar2);
  uVar2 = -(ulong)(dVar3 < -dVar3);
  dVar3 = (double)(~uVar2 & (ulong)dVar3 | (ulong)-dVar3 & uVar2);
  if (dVar3 <= dVar5) {
    dVar5 = dVar3;
  }
  if (dVar5 < (double)(~uVar1 & (ulong)dVar4 | (ulong)-dVar4 & uVar1) * 1000000000000.0) {
    position(this);
    QGraphicsItem::pos();
    QGraphicsItem::pos();
    QGraphicsItem::setPos((QPointF *)&this->super_QGraphicsRectItem);
    moved(this,_t1);
  }
  return;
}

Assistant:

void RectHandle::setPosition(double p) {
    p = qBound(m_min_pos, p, m_max_pos);
    if (qFuzzyCompare(p, position()))
        return;

    if (m_orientation == Qt::Horizontal)
        moveBy(0, p - position());
    else
        moveBy(p - position(), 0);

    emit moved(p);
}